

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseQuotedText(WastParser *this,string *text)

{
  char c;
  bool bVar1;
  Result RVar2;
  value_type *__value;
  value_type *pvVar3;
  uint32_t hi;
  uint32_t lo;
  string_view local_88;
  undefined8 local_78;
  Token token;
  
  bVar1 = PeekMatch(this,Text);
  if (bVar1) {
    Consume(&token,this);
    local_88 = Token::text(&token);
    if (2 < local_88.size_) {
      local_88 = string_view::substr(&local_88,1,local_88.size_ - 2);
      __value = local_88.data_;
      pvVar3 = __value + local_88.size_;
      for (; __value < pvVar3; __value = __value + 1) {
        if (*__value == '\\') {
          c = __value[1];
          if (((((c == '\"') || (c == '\'')) || (c == '\\')) || ((c == 't' || (c == 'r')))) ||
             (c == 'n')) {
            std::__cxx11::string::push_back((char)text);
            __value = __value + 1;
          }
          else {
            RVar2 = ParseHexdigit(c,&hi);
            if ((RVar2.enum_ != Ok) || (RVar2 = ParseHexdigit(__value[2],&lo), RVar2.enum_ != Ok)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wast-parser.cc"
                            ,0x58,
                            "void wabt::(anonymous namespace)::RemoveEscapes(string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::basic_string<char>>]"
                           );
            }
            __value = __value + 2;
            std::__cxx11::string::push_back((char)text);
          }
        }
        else {
          _hi = text;
          std::
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&hi,__value);
        }
      }
    }
    bVar1 = IsValidUtf8((text->_M_dataplus)._M_p,text->_M_string_length);
    if (!bVar1) {
      Error(this,0x199384);
    }
    RVar2.enum_ = Ok;
  }
  else {
    std::__cxx11::string::string((string *)&token,"a quoted string",(allocator *)&hi);
    local_88 = (string_view)ZEXT816(0);
    local_78 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,&token
               ,&token.token_type_);
    RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_88,"\"foo\"");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88);
    std::__cxx11::string::_M_dispose();
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result WastParser::ParseQuotedText(std::string* text) {
  WABT_TRACE(ParseQuotedText);
  if (!PeekMatch(TokenType::Text)) {
    return ErrorExpected({"a quoted string"}, "\"foo\"");
  }

  Token token = Consume();
  RemoveEscapes(token.text(), std::back_inserter(*text));
  if (!IsValidUtf8(text->data(), text->length())) {
    Error(token.loc, "quoted string has an invalid utf-8 encoding");
  }
  return Result::Ok;
}